

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

void __thiscall
vkb::Swapchain::destroy_image_views
          (Swapchain *this,vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *image_views)

{
  pointer ppVVar1;
  VkImageView_T **image_view;
  pointer ppVVar2;
  
  ppVVar1 = (image_views->super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppVVar2 = (image_views->super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppVVar2 != ppVVar1;
      ppVVar2 = ppVVar2 + 1) {
    (*(this->internal_table).fp_vkDestroyImageView)
              (this->device,*ppVVar2,this->allocation_callbacks);
  }
  return;
}

Assistant:

void Swapchain::destroy_image_views(std::vector<VkImageView> const& image_views) {
    for (auto& image_view : image_views) {
        internal_table.fp_vkDestroyImageView(device, image_view, allocation_callbacks);
    }
}